

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Lib::Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList>_>::expand
          (Stack<Lib::Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList>_> *this)

{
  Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *pCVar1;
  Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *pCVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  sVar6 = 8;
  if (this->_capacity != 0) {
    sVar6 = this->_capacity * 2;
  }
  uVar5 = sVar6 * 0xc + 0xf & 0xfffffffffffffff0;
  if (uVar5 == 0) {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 0x11) {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar5 < 0x19) {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar5 < 0x21) {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar5 < 0x31) {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar5 < 0x41) {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pCVar2 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
             ::operator_new(uVar5,0x10);
  }
  if (this->_capacity == 0) {
    uVar5 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    do {
      pCVar1 = this->_stack;
      *(undefined4 *)((pCVar2->_inner)._content + lVar3 + 7) =
           *(undefined4 *)((pCVar1->_inner)._content + lVar3 + 7);
      *(undefined8 *)((pCVar2->_inner)._content + lVar3 + -1) =
           *(undefined8 *)((pCVar1->_inner)._content + lVar3 + -1);
      uVar4 = uVar4 + 1;
      uVar5 = this->_capacity;
      lVar3 = lVar3 + 0xc;
    } while (uVar4 < uVar5);
    pCVar1 = this->_stack;
    if (pCVar1 != (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)0x0) {
      uVar4 = uVar5 * 0xc + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *(undefined8 *)&pCVar1->_inner = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar1;
      }
      else if (uVar4 < 0x11) {
        *(undefined8 *)&pCVar1->_inner = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar1;
      }
      else if (uVar4 < 0x19) {
        *(undefined8 *)&pCVar1->_inner = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar1;
      }
      else if (uVar4 < 0x21) {
        *(undefined8 *)&pCVar1->_inner = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar1;
      }
      else if (uVar4 < 0x31) {
        *(undefined8 *)&pCVar1->_inner = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar1;
      }
      else if (uVar4 < 0x41) {
        *(undefined8 *)&pCVar1->_inner = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar1;
      }
      else {
        operator_delete(pCVar1,0x10);
        uVar5 = this->_capacity;
      }
    }
  }
  this->_stack = pCVar2;
  this->_cursor = pCVar2 + uVar5;
  this->_end = pCVar2 + sVar6;
  this->_capacity = sVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }